

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sumStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  bool bVar1;
  int iVar2;
  SumCtx *pSum;
  ulong uVar3;
  i64 iVar4;
  ulong uVar5;
  double dVar6;
  
  if ((short)context->pMem->flags < 0) {
    pSum = (SumCtx *)context->pMem->z;
  }
  else {
    pSum = (SumCtx *)createAggContext(context,0x28);
  }
  iVar2 = sqlite3_value_numeric_type(*argv);
  if (iVar2 == 5 || pSum == (SumCtx *)0x0) {
    return;
  }
  pSum->cnt = pSum->cnt + 1;
  if (pSum->approx != '\0') {
    if (iVar2 != 1) {
      pSum->ovrfl = '\0';
      goto LAB_001b1686;
    }
    goto LAB_001b1736;
  }
  uVar5 = pSum->iSum;
  if (iVar2 != 1) {
    if (uVar5 + 0xfff0000000000000 < 0xffe0000000000001) {
      uVar3 = uVar5 + 0x3fff;
      if (-1 < (long)uVar5) {
        uVar3 = uVar5;
      }
      pSum->rSum = (double)(long)(uVar3 & 0xffffffffffffc000);
      dVar6 = (double)((long)uVar5 % 0x4000);
    }
    else {
      pSum->rSum = (double)(long)uVar5;
      dVar6 = 0.0;
    }
    pSum->rErr = dVar6;
    pSum->approx = '\x01';
LAB_001b1686:
    dVar6 = sqlite3VdbeRealValue(*argv);
    kahanBabuskaNeumaierStep(pSum,dVar6);
    return;
  }
  iVar4 = sqlite3VdbeIntValue(*argv);
  if (iVar4 < 0) {
    if (((long)uVar5 < 0) && (iVar4 + 1 < (long)(-0x7fffffffffffffff - uVar5))) goto LAB_001b1623;
LAB_001b16be:
    uVar5 = uVar5 + iVar4;
    bVar1 = true;
  }
  else {
    if ((long)uVar5 < 1 || iVar4 <= (long)(0x7fffffffffffffff - uVar5)) goto LAB_001b16be;
LAB_001b1623:
    bVar1 = false;
  }
  if (bVar1) {
    pSum->iSum = uVar5;
    return;
  }
  pSum->ovrfl = '\x01';
  uVar5 = pSum->iSum;
  if (uVar5 + 0xfff0000000000000 < 0xffe0000000000001) {
    uVar3 = uVar5 + 0x3fff;
    if (-1 < (long)uVar5) {
      uVar3 = uVar5;
    }
    pSum->rSum = (double)(long)(uVar3 & 0xffffffffffffc000);
    dVar6 = (double)((long)uVar5 % 0x4000);
  }
  else {
    pSum->rSum = (double)(long)uVar5;
    dVar6 = 0.0;
  }
  pSum->rErr = dVar6;
  pSum->approx = '\x01';
LAB_001b1736:
  iVar4 = sqlite3VdbeIntValue(*argv);
  kahanBabuskaNeumaierStepInt64(pSum,iVar4);
  return;
}

Assistant:

static void sumStep(sqlite3_context *context, int argc, sqlite3_value **argv){
  SumCtx *p;
  int type;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  p = sqlite3_aggregate_context(context, sizeof(*p));
  type = sqlite3_value_numeric_type(argv[0]);
  if( p && type!=SQLITE_NULL ){
    p->cnt++;
    if( p->approx==0 ){
      if( type!=SQLITE_INTEGER ){
        kahanBabuskaNeumaierInit(p, p->iSum);
        p->approx = 1;
        kahanBabuskaNeumaierStep(p, sqlite3_value_double(argv[0]));
      }else{
        i64 x = p->iSum;
        if( sqlite3AddInt64(&x, sqlite3_value_int64(argv[0]))==0 ){
          p->iSum = x;
        }else{
          p->ovrfl = 1;
          kahanBabuskaNeumaierInit(p, p->iSum);
          p->approx = 1;
          kahanBabuskaNeumaierStepInt64(p, sqlite3_value_int64(argv[0]));
        }
      }
    }else{
      if( type==SQLITE_INTEGER ){
        kahanBabuskaNeumaierStepInt64(p, sqlite3_value_int64(argv[0]));
      }else{
        p->ovrfl = 0;
        kahanBabuskaNeumaierStep(p, sqlite3_value_double(argv[0]));
      }
    }
  }
}